

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

long xmlByteConsumed(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlCharEncodingHandler *handler;
  uchar *in;
  ulong uVar2;
  xmlCharEncError xVar3;
  uchar *out;
  xmlChar *pxVar4;
  uchar *cur;
  int unused;
  int toconv;
  int local_28 [2];
  
  pxVar4 = (xmlChar *)0xffffffffffffffff;
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    pxVar1 = ctxt->input;
    if (pxVar1 != (xmlParserInputPtr)0x0) {
      if ((pxVar1->buf == (xmlParserInputBufferPtr)0x0) ||
         (handler = pxVar1->buf->encoder, handler == (xmlCharEncodingHandler *)0x0)) {
        pxVar4 = pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base);
      }
      else {
        local_28[0] = 0;
        local_28[1] = -1;
        in = pxVar1->cur;
        if (pxVar1->end != in && -1 < (long)pxVar1->end - (long)in) {
          out = (uchar *)(*xmlMalloc)(32000);
          if (out == (uchar *)0x0) {
            return -1;
          }
          local_28[1] = *(int *)&pxVar1->end - (int)in;
          local_28[0] = 32000;
          xVar3 = xmlEncOutputChunk(handler,out,local_28,in,local_28 + 1);
          (*xmlFree)(out);
          if (xVar3 != XML_ENC_ERR_SUCCESS) {
            return -1;
          }
        }
        uVar2 = pxVar1->buf->rawconsumed;
        pxVar4 = (xmlChar *)0xffffffffffffffff;
        if ((ulong)(long)local_28[0] <= uVar2) {
          pxVar4 = (xmlChar *)(uVar2 - (long)local_28[0]);
        }
      }
    }
  }
  return (long)pxVar4;
}

Assistant:

long
xmlByteConsumed(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr in;

    if (ctxt == NULL)
        return(-1);
    in = ctxt->input;
    if (in == NULL)
        return(-1);

    if ((in->buf != NULL) && (in->buf->encoder != NULL)) {
        int unused = 0;
	xmlCharEncodingHandler * handler = in->buf->encoder;

        /*
	 * Encoding conversion, compute the number of unused original
	 * bytes from the input not consumed and subtract that from
	 * the raw consumed value, this is not a cheap operation
	 */
        if (in->end - in->cur > 0) {
	    unsigned char *convbuf;
	    const unsigned char *cur = (const unsigned char *)in->cur;
	    int toconv, ret;

            convbuf = xmlMalloc(32000);
            if (convbuf == NULL)
                return(-1);

            toconv = in->end - cur;
            unused = 32000;
            ret = xmlEncOutputChunk(handler, convbuf, &unused, cur, &toconv);

            xmlFree(convbuf);

            if (ret != XML_ENC_ERR_SUCCESS)
                return(-1);
	}

	if (in->buf->rawconsumed < (unsigned long) unused)
	    return(-1);
	return(in->buf->rawconsumed - unused);
    }

    return(in->consumed + (in->cur - in->base));
}